

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O3

void __thiscall NaStateSpaceModel::Save(NaStateSpaceModel *this)

{
  NaDataStream *in_RSI;
  
  Save((NaStateSpaceModel *)&this[-1].x.pVect,in_RSI);
  return;
}

Assistant:

void
NaStateSpaceModel::Save (NaDataStream& ds)
{
    unsigned     i, j;
    char    *szBuf, szComment[100];

    ds.PutComment(" State space discrete time model:");
    ds.PutComment("   x(t+1) = A*x(t) + B*u(t)");
    ds.PutComment("   y(t)   = C*x(t) + D*u(t)");
    ds.PutComment(" Matrices: A(N,N), B(N,K), C(M,N), D(M,K)");
    ds.PutComment("   N - state vector, M - outputs, K - inputs");
    ds.PutF("Dimensions N M K", "%u %u %u", n, m, k);

    sprintf(szComment, " Matrix A(%u,%u), %u numbers:", n, n, n*n);
    ds.PutComment(szComment);
    szBuf = new char[20*A.dim_cols()];
    for(i = 0; i < A.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < A.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", A[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    sprintf(szComment, " Matrix B(%u,%u), %u numbers:", n, k, n*k);
    ds.PutComment(szComment);
    szBuf = new char[20*B.dim_cols()];
    for(i = 0; i < B.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < B.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", B[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    sprintf(szComment, " Matrix C(%u,%u), %u numbers:", m, n, m*n);
    ds.PutComment(szComment);
    szBuf = new char[20*C.dim_cols()];
    for(i = 0; i < C.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < C.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", C[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    sprintf(szComment, " Matrix D(%u,%u), %u numbers:", m, k, m*k);
    ds.PutComment(szComment);
    szBuf = new char[20*D.dim_cols()];
    for(i = 0; i < D.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < D.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", D[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    // Since x0 may be em[ty due to zero initial conditions, then
    // special algorithm to save it is used.
    ds.PutComment(" Initial state x(0):");
    szBuf = new char[20*n];
    szBuf[0] = '\0';
    for(i = 0; i < n; ++i){
	NaReal fX0i = (i < x0.dim())? x0[i]: 0.0;
	sprintf(szBuf + strlen(szBuf), " %g", fX0i);
    }
    ds.PutF(NULL, "%s", szBuf);
    delete[] szBuf;
}